

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::BufferTestUtil::BufferWriter::BufferWriter
          (BufferWriter *this,RenderContext *renderCtx,TestLog *log,WriteType writeType)

{
  BufferWriterBase *pBVar1;
  TestError *this_00;
  WriteType writeType_local;
  TestLog *log_local;
  RenderContext *renderCtx_local;
  BufferWriter *this_local;
  
  this->m_writer = (BufferWriterBase *)0x0;
  if (writeType == WRITE_BUFFER_SUB_DATA) {
    pBVar1 = (BufferWriterBase *)operator_new(0x28);
    BufferSubDataWriter::BufferSubDataWriter((BufferSubDataWriter *)pBVar1,renderCtx,log);
    this->m_writer = pBVar1;
  }
  else {
    if (writeType != WRITE_BUFFER_WRITE_MAP) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported writer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                 ,0x113);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pBVar1 = (BufferWriterBase *)operator_new(0x28);
    BufferWriteMapWriter::BufferWriteMapWriter((BufferWriteMapWriter *)pBVar1,renderCtx,log);
    this->m_writer = pBVar1;
  }
  return;
}

Assistant:

BufferWriter::BufferWriter (glu::RenderContext& renderCtx, tcu::TestLog& log, WriteType writeType)
	: m_writer(DE_NULL)
{
	switch (writeType)
	{
		case WRITE_BUFFER_SUB_DATA:		m_writer = new BufferSubDataWriter	(renderCtx, log);	break;
		case WRITE_BUFFER_WRITE_MAP:	m_writer = new BufferWriteMapWriter	(renderCtx, log);	break;
		default:
			TCU_FAIL("Unsupported writer");
	}
}